

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

aiScene * __thiscall
Assimp::BaseImporter::ReadFile(BaseImporter *this,Importer *pImp,string *pFile,IOSystem *pIOHandler)

{
  ProgressHandler *pPVar1;
  aiScene *this_00;
  pointer paVar2;
  exception *err;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> local_a8;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> sc;
  FileSystemFilter filter;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  Importer *pImp_local;
  BaseImporter *this_local;
  
  pPVar1 = Importer::GetProgressHandler(pImp);
  this->m_progress = pPVar1;
  if (this->m_progress == (ProgressHandler *)0x0) {
    this_local = (BaseImporter *)0x0;
  }
  else {
    if (this->m_progress == (ProgressHandler *)0x0) {
      __assert_fail("m_progress",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                    ,0x67,
                    "aiScene *Assimp::BaseImporter::ReadFile(Importer *, const std::string &, IOSystem *)"
                   );
    }
    (*this->_vptr_BaseImporter[4])(this,pImp);
    FileSystemFilter::FileSystemFilter((FileSystemFilter *)&sc,pFile,pIOHandler);
    this_00 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(this_00);
    std::unique_ptr<aiScene,std::default_delete<aiScene>>::
    unique_ptr<std::default_delete<aiScene>,void>
              ((unique_ptr<aiScene,std::default_delete<aiScene>> *)&local_a8,this_00);
    paVar2 = std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::get(&local_a8);
    (*this->_vptr_BaseImporter[10])(this,pFile,paVar2,&sc);
    (**this->_vptr_BaseImporter)(this,pImp);
    this_local = (BaseImporter *)
                 std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::release(&local_a8);
    std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr(&local_a8);
    FileSystemFilter::~FileSystemFilter((FileSystemFilter *)&sc);
  }
  return (aiScene *)this_local;
}

Assistant:

aiScene* BaseImporter::ReadFile(Importer* pImp, const std::string& pFile, IOSystem* pIOHandler) {


    m_progress = pImp->GetProgressHandler();
    if (nullptr == m_progress) {
        return nullptr;
    }

    ai_assert(m_progress);

    // Gather configuration properties for this run
    SetupProperties( pImp );

    // Construct a file system filter to improve our success ratio at reading external files
    FileSystemFilter filter(pFile,pIOHandler);

    // create a scene object to hold the data
    std::unique_ptr<aiScene> sc(new aiScene());

    // dispatch importing
    try
    {
        InternReadFile( pFile, sc.get(), &filter);

        // Calculate import scale hook - required because pImp not available anywhere else
        // passes scale into ScaleProcess
        UpdateImporterScale(pImp);


    } catch( const std::exception& err )    {
        // extract error description
        m_ErrorText = err.what();
        ASSIMP_LOG_ERROR(m_ErrorText);
        return nullptr;
    }

    // return what we gathered from the import.
    return sc.release();
}